

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intrapred_ssse3.c
# Opt level: O0

void aom_smooth_v_predictor_8x4_ssse3
               (uint8_t *dst,ptrdiff_t stride,uint8_t *top_row,uint8_t *left_column)

{
  undefined8 uVar1;
  byte bVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  long in_RCX;
  undefined8 *in_RDX;
  long in_RSI;
  undefined8 *in_RDI;
  undefined8 *puVar12;
  ushort uVar13;
  ushort uVar15;
  ushort uVar19;
  ushort uVar21;
  ushort uVar23;
  ushort uVar25;
  ushort uVar27;
  ushort uVar29;
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  ushort uVar14;
  ushort uVar20;
  ushort uVar22;
  ushort uVar24;
  ushort uVar26;
  ushort uVar28;
  ushort uVar30;
  ushort uVar31;
  ushort uVar32;
  undefined1 auVar18 [16];
  short sVar33;
  short sVar34;
  short sVar35;
  short sVar36;
  short sVar37;
  short sVar38;
  short sVar39;
  __m128i weights;
  __m128i bottom_left;
  int val;
  __m128i pred_3;
  __m128i pred_sum_3;
  __m128i pred_2;
  __m128i pred_sum_2;
  __m128i pred_1;
  __m128i pred_sum_1;
  __m128i pred;
  __m128i pred_sum;
  __m128i weighted_px;
  __m128i weighted_px_1;
  __m128i weighted_px_2;
  __m128i weighted_px_3;
  undefined1 local_7a8;
  undefined1 uStack_7a7;
  undefined1 uStack_7a6;
  undefined1 uStack_7a5;
  undefined1 uStack_7a4;
  undefined1 uStack_7a3;
  undefined1 uStack_7a2;
  undefined1 uStack_7a1;
  undefined2 uStack_706;
  undefined2 uStack_704;
  undefined2 uStack_702;
  undefined2 uStack_6fe;
  undefined2 uStack_6fc;
  undefined2 uStack_6fa;
  undefined2 local_238;
  undefined2 uStack_236;
  undefined2 uStack_234;
  undefined2 uStack_232;
  undefined2 uStack_230;
  undefined2 uStack_22e;
  undefined2 uStack_22c;
  undefined2 uStack_22a;
  undefined2 local_228;
  undefined2 uStack_226;
  undefined2 uStack_224;
  undefined2 uStack_222;
  undefined2 uStack_220;
  undefined2 uStack_21e;
  undefined2 uStack_21c;
  undefined2 uStack_21a;
  undefined2 uStack_216;
  undefined2 uStack_214;
  undefined2 uStack_212;
  undefined2 uStack_20e;
  undefined2 uStack_20c;
  undefined2 uStack_20a;
  undefined2 local_1b8;
  undefined2 uStack_1b6;
  undefined2 uStack_1b4;
  undefined2 uStack_1b2;
  undefined2 uStack_1b0;
  undefined2 uStack_1ae;
  undefined2 uStack_1ac;
  undefined2 uStack_1aa;
  undefined2 local_1a8;
  undefined2 uStack_1a6;
  undefined2 uStack_1a4;
  undefined2 uStack_1a2;
  undefined2 uStack_1a0;
  undefined2 uStack_19e;
  undefined2 uStack_19c;
  undefined2 uStack_19a;
  undefined2 uStack_196;
  undefined2 uStack_194;
  undefined2 uStack_192;
  undefined2 uStack_18e;
  undefined2 uStack_18c;
  undefined2 uStack_18a;
  undefined2 local_138;
  undefined2 uStack_136;
  undefined2 uStack_134;
  undefined2 uStack_132;
  undefined2 uStack_130;
  undefined2 uStack_12e;
  undefined2 uStack_12c;
  undefined2 uStack_12a;
  undefined2 local_128;
  undefined2 uStack_126;
  undefined2 uStack_124;
  undefined2 uStack_122;
  undefined2 uStack_120;
  undefined2 uStack_11e;
  undefined2 uStack_11c;
  undefined2 uStack_11a;
  undefined2 uStack_116;
  undefined2 uStack_114;
  undefined2 uStack_112;
  undefined2 uStack_10e;
  undefined2 uStack_10c;
  undefined2 uStack_10a;
  undefined2 local_b8;
  undefined2 uStack_b6;
  undefined2 uStack_b4;
  undefined2 uStack_b2;
  undefined2 uStack_b0;
  undefined2 uStack_ae;
  undefined2 uStack_ac;
  undefined2 uStack_aa;
  undefined2 local_a8;
  undefined2 uStack_a6;
  undefined2 uStack_a4;
  undefined2 uStack_a2;
  undefined2 uStack_a0;
  undefined2 uStack_9e;
  undefined2 uStack_9c;
  undefined2 uStack_9a;
  undefined2 uStack_96;
  undefined2 uStack_94;
  undefined2 uStack_92;
  undefined2 uStack_8e;
  undefined2 uStack_8c;
  undefined2 uStack_8a;
  __m128i scaled_bottom_left_y;
  __m128i weights_y;
  __m128i top;
  __m128i y_select;
  __m128i round;
  __m128i scaled_bottom_left;
  __m128i inverted_weights;
  __m128i scale;
  
  bVar2 = *(byte *)(in_RCX + 3);
  uVar15 = CONCAT11(0,bVar2);
  uStack_706 = (ushort)bVar2;
  uStack_704 = (ushort)bVar2;
  uStack_702 = (ushort)bVar2;
  uStack_6fe = (ushort)bVar2;
  uStack_6fc = (ushort)bVar2;
  uStack_6fa = (ushort)bVar2;
  sVar33 = uStack_706 * 0x6b;
  sVar34 = uStack_704 * 0xab;
  sVar35 = uStack_702 * 0xc0;
  sVar36 = uVar15 * 0x100;
  sVar37 = uStack_6fe * 0x100;
  sVar38 = uStack_6fc * 0x100;
  sVar39 = uStack_6fa * 0x100;
  uVar1 = *in_RDX;
  local_7a8 = (byte)uVar1;
  uStack_7a7 = (byte)((ulong)uVar1 >> 8);
  uStack_7a6 = (byte)((ulong)uVar1 >> 0x10);
  uStack_7a5 = (byte)((ulong)uVar1 >> 0x18);
  uStack_7a4 = (byte)((ulong)uVar1 >> 0x20);
  uStack_7a3 = (byte)((ulong)uVar1 >> 0x28);
  uStack_7a2 = (byte)((ulong)uVar1 >> 0x30);
  uStack_7a1 = (byte)((ulong)uVar1 >> 0x38);
  auVar11._8_8_ = 0x100010001000100;
  auVar11._0_8_ = 0x100010001000100;
  auVar16 = pshufb(ZEXT716(0x400055009500ff),auVar11);
  auVar10._2_2_ = sVar33;
  auVar10._0_2_ = uVar15;
  auVar10._4_2_ = sVar34;
  auVar10._6_2_ = sVar35;
  auVar10._10_2_ = sVar37;
  auVar10._8_2_ = sVar36;
  auVar10._12_2_ = sVar38;
  auVar10._14_2_ = sVar39;
  auVar9._8_8_ = 0x100010001000100;
  auVar9._0_8_ = 0x100010001000100;
  auVar17 = pshufb(auVar10,auVar9);
  uStack_216 = (ushort)uStack_7a7;
  uStack_214 = (ushort)uStack_7a6;
  uStack_212 = (ushort)uStack_7a5;
  uStack_20e = (ushort)uStack_7a3;
  uStack_20c = (ushort)uStack_7a2;
  uStack_20a = (ushort)uStack_7a1;
  local_228 = auVar16._0_2_;
  uStack_226 = auVar16._2_2_;
  uStack_224 = auVar16._4_2_;
  uStack_222 = auVar16._6_2_;
  uStack_220 = auVar16._8_2_;
  uStack_21e = auVar16._10_2_;
  uStack_21c = auVar16._12_2_;
  uStack_21a = auVar16._14_2_;
  local_238 = auVar17._0_2_;
  uStack_236 = auVar17._2_2_;
  uStack_234 = auVar17._4_2_;
  uStack_232 = auVar17._6_2_;
  uStack_230 = auVar17._8_2_;
  uStack_22e = auVar17._10_2_;
  uStack_22c = auVar17._12_2_;
  uStack_22a = auVar17._14_2_;
  uVar13 = local_238 + (ushort)local_7a8 * local_228 + 0x80;
  uVar19 = uStack_236 + uStack_216 * uStack_226 + 0x80;
  uVar21 = uStack_234 + uStack_214 * uStack_224 + 0x80;
  uVar23 = uStack_232 + uStack_212 * uStack_222 + 0x80;
  uVar25 = uStack_230 + (ushort)uStack_7a4 * uStack_220 + 0x80;
  uVar27 = uStack_22e + uStack_20e * uStack_21e + 0x80;
  uVar29 = uStack_22c + uStack_20c * uStack_21c + 0x80;
  uVar31 = uStack_22a + uStack_20a * uStack_21a + 0x80;
  uVar14 = uVar13 >> 8;
  uVar20 = uVar19 >> 8;
  uVar22 = uVar21 >> 8;
  uVar24 = uVar23 >> 8;
  uVar26 = uVar25 >> 8;
  uVar28 = uVar27 >> 8;
  uVar30 = uVar29 >> 8;
  uVar32 = uVar31 >> 8;
  *in_RDI = CONCAT17((uVar32 != 0) * (uVar32 < 0x100) * (char)(uVar31 >> 8) - (0xff < uVar32),
                     CONCAT16((uVar30 != 0) * (uVar30 < 0x100) * (char)(uVar29 >> 8) -
                              (0xff < uVar30),
                              CONCAT15((uVar28 != 0) * (uVar28 < 0x100) * (char)(uVar27 >> 8) -
                                       (0xff < uVar28),
                                       CONCAT14((uVar26 != 0) * (uVar26 < 0x100) *
                                                (char)(uVar25 >> 8) - (0xff < uVar26),
                                                CONCAT13((uVar24 != 0) * (uVar24 < 0x100) *
                                                         (char)(uVar23 >> 8) - (0xff < uVar24),
                                                         CONCAT12((uVar22 != 0) * (uVar22 < 0x100) *
                                                                  (char)(uVar21 >> 8) -
                                                                  (0xff < uVar22),
                                                                  CONCAT11((uVar20 != 0) *
                                                                           (uVar20 < 0x100) *
                                                                           (char)(uVar19 >> 8) -
                                                                           (0xff < uVar20),
                                                                           (uVar14 != 0) *
                                                                           (uVar14 < 0x100) *
                                                                           (char)(uVar13 >> 8) -
                                                                           (0xff < uVar14))))))));
  auVar8._8_8_ = 0x302030203020302;
  auVar8._0_8_ = 0x302030203020302;
  auVar16 = pshufb(ZEXT716(0x400055009500ff),auVar8);
  auVar7._2_2_ = sVar33;
  auVar7._0_2_ = uVar15;
  auVar7._4_2_ = sVar34;
  auVar7._6_2_ = sVar35;
  auVar7._10_2_ = sVar37;
  auVar7._8_2_ = sVar36;
  auVar7._12_2_ = sVar38;
  auVar7._14_2_ = sVar39;
  auVar6._8_8_ = 0x302030203020302;
  auVar6._0_8_ = 0x302030203020302;
  auVar17 = pshufb(auVar7,auVar6);
  uStack_196 = (ushort)uStack_7a7;
  uStack_194 = (ushort)uStack_7a6;
  uStack_192 = (ushort)uStack_7a5;
  uStack_18e = (ushort)uStack_7a3;
  uStack_18c = (ushort)uStack_7a2;
  uStack_18a = (ushort)uStack_7a1;
  local_1a8 = auVar16._0_2_;
  uStack_1a6 = auVar16._2_2_;
  uStack_1a4 = auVar16._4_2_;
  uStack_1a2 = auVar16._6_2_;
  uStack_1a0 = auVar16._8_2_;
  uStack_19e = auVar16._10_2_;
  uStack_19c = auVar16._12_2_;
  uStack_19a = auVar16._14_2_;
  local_1b8 = auVar17._0_2_;
  uStack_1b6 = auVar17._2_2_;
  uStack_1b4 = auVar17._4_2_;
  uStack_1b2 = auVar17._6_2_;
  uStack_1b0 = auVar17._8_2_;
  uStack_1ae = auVar17._10_2_;
  uStack_1ac = auVar17._12_2_;
  uStack_1aa = auVar17._14_2_;
  uVar13 = local_1b8 + (ushort)local_7a8 * local_1a8 + 0x80;
  uVar19 = uStack_1b6 + uStack_196 * uStack_1a6 + 0x80;
  uVar21 = uStack_1b4 + uStack_194 * uStack_1a4 + 0x80;
  uVar23 = uStack_1b2 + uStack_192 * uStack_1a2 + 0x80;
  uVar25 = uStack_1b0 + (ushort)uStack_7a4 * uStack_1a0 + 0x80;
  uVar27 = uStack_1ae + uStack_18e * uStack_19e + 0x80;
  uVar29 = uStack_1ac + uStack_18c * uStack_19c + 0x80;
  uVar31 = uStack_1aa + uStack_18a * uStack_19a + 0x80;
  uVar14 = uVar13 >> 8;
  uVar20 = uVar19 >> 8;
  uVar22 = uVar21 >> 8;
  uVar24 = uVar23 >> 8;
  uVar26 = uVar25 >> 8;
  uVar28 = uVar27 >> 8;
  uVar30 = uVar29 >> 8;
  uVar32 = uVar31 >> 8;
  *(undefined8 *)((long)in_RDI + in_RSI) =
       CONCAT17((uVar32 != 0) * (uVar32 < 0x100) * (char)(uVar31 >> 8) - (0xff < uVar32),
                CONCAT16((uVar30 != 0) * (uVar30 < 0x100) * (char)(uVar29 >> 8) - (0xff < uVar30),
                         CONCAT15((uVar28 != 0) * (uVar28 < 0x100) * (char)(uVar27 >> 8) -
                                  (0xff < uVar28),
                                  CONCAT14((uVar26 != 0) * (uVar26 < 0x100) * (char)(uVar25 >> 8) -
                                           (0xff < uVar26),
                                           CONCAT13((uVar24 != 0) * (uVar24 < 0x100) *
                                                    (char)(uVar23 >> 8) - (0xff < uVar24),
                                                    CONCAT12((uVar22 != 0) * (uVar22 < 0x100) *
                                                             (char)(uVar21 >> 8) - (0xff < uVar22),
                                                             CONCAT11((uVar20 != 0) *
                                                                      (uVar20 < 0x100) *
                                                                      (char)(uVar19 >> 8) -
                                                                      (0xff < uVar20),
                                                                      (uVar14 != 0) *
                                                                      (uVar14 < 0x100) *
                                                                      (char)(uVar13 >> 8) -
                                                                      (0xff < uVar14))))))));
  puVar12 = (undefined8 *)((long)in_RDI + in_RSI + in_RSI);
  auVar5._8_8_ = 0x504050405040504;
  auVar5._0_8_ = 0x504050405040504;
  auVar16 = pshufb(ZEXT716(0x400055009500ff),auVar5);
  auVar4._2_2_ = sVar33;
  auVar4._0_2_ = uVar15;
  auVar4._4_2_ = sVar34;
  auVar4._6_2_ = sVar35;
  auVar4._10_2_ = sVar37;
  auVar4._8_2_ = sVar36;
  auVar4._12_2_ = sVar38;
  auVar4._14_2_ = sVar39;
  auVar3._8_8_ = 0x504050405040504;
  auVar3._0_8_ = 0x504050405040504;
  auVar17 = pshufb(auVar4,auVar3);
  uStack_116 = (ushort)uStack_7a7;
  uStack_114 = (ushort)uStack_7a6;
  uStack_112 = (ushort)uStack_7a5;
  uStack_10e = (ushort)uStack_7a3;
  uStack_10c = (ushort)uStack_7a2;
  uStack_10a = (ushort)uStack_7a1;
  local_128 = auVar16._0_2_;
  uStack_126 = auVar16._2_2_;
  uStack_124 = auVar16._4_2_;
  uStack_122 = auVar16._6_2_;
  uStack_120 = auVar16._8_2_;
  uStack_11e = auVar16._10_2_;
  uStack_11c = auVar16._12_2_;
  uStack_11a = auVar16._14_2_;
  local_138 = auVar17._0_2_;
  uStack_136 = auVar17._2_2_;
  uStack_134 = auVar17._4_2_;
  uStack_132 = auVar17._6_2_;
  uStack_130 = auVar17._8_2_;
  uStack_12e = auVar17._10_2_;
  uStack_12c = auVar17._12_2_;
  uStack_12a = auVar17._14_2_;
  uVar13 = local_138 + (ushort)local_7a8 * local_128 + 0x80;
  uVar19 = uStack_136 + uStack_116 * uStack_126 + 0x80;
  uVar21 = uStack_134 + uStack_114 * uStack_124 + 0x80;
  uVar23 = uStack_132 + uStack_112 * uStack_122 + 0x80;
  uVar25 = uStack_130 + (ushort)uStack_7a4 * uStack_120 + 0x80;
  uVar27 = uStack_12e + uStack_10e * uStack_11e + 0x80;
  uVar29 = uStack_12c + uStack_10c * uStack_11c + 0x80;
  uVar31 = uStack_12a + uStack_10a * uStack_11a + 0x80;
  uVar14 = uVar13 >> 8;
  uVar20 = uVar19 >> 8;
  uVar22 = uVar21 >> 8;
  uVar24 = uVar23 >> 8;
  uVar26 = uVar25 >> 8;
  uVar28 = uVar27 >> 8;
  uVar30 = uVar29 >> 8;
  uVar32 = uVar31 >> 8;
  *puVar12 = CONCAT17((uVar32 != 0) * (uVar32 < 0x100) * (char)(uVar31 >> 8) - (0xff < uVar32),
                      CONCAT16((uVar30 != 0) * (uVar30 < 0x100) * (char)(uVar29 >> 8) -
                               (0xff < uVar30),
                               CONCAT15((uVar28 != 0) * (uVar28 < 0x100) * (char)(uVar27 >> 8) -
                                        (0xff < uVar28),
                                        CONCAT14((uVar26 != 0) * (uVar26 < 0x100) *
                                                 (char)(uVar25 >> 8) - (0xff < uVar26),
                                                 CONCAT13((uVar24 != 0) * (uVar24 < 0x100) *
                                                          (char)(uVar23 >> 8) - (0xff < uVar24),
                                                          CONCAT12((uVar22 != 0) * (uVar22 < 0x100)
                                                                   * (char)(uVar21 >> 8) -
                                                                   (0xff < uVar22),
                                                                   CONCAT11((uVar20 != 0) *
                                                                            (uVar20 < 0x100) *
                                                                            (char)(uVar19 >> 8) -
                                                                            (0xff < uVar20),
                                                                            (uVar14 != 0) *
                                                                            (uVar14 < 0x100) *
                                                                            (char)(uVar13 >> 8) -
                                                                            (0xff < uVar14))))))));
  auVar18._8_8_ = 0x706070607060706;
  auVar18._0_8_ = 0x706070607060706;
  auVar18 = pshufb(ZEXT716(0x400055009500ff),auVar18);
  auVar17._2_2_ = sVar33;
  auVar17._0_2_ = uVar15;
  auVar17._4_2_ = sVar34;
  auVar17._6_2_ = sVar35;
  auVar17._10_2_ = sVar37;
  auVar17._8_2_ = sVar36;
  auVar17._12_2_ = sVar38;
  auVar17._14_2_ = sVar39;
  auVar16._8_8_ = 0x706070607060706;
  auVar16._0_8_ = 0x706070607060706;
  auVar16 = pshufb(auVar17,auVar16);
  uStack_96 = (ushort)uStack_7a7;
  uStack_94 = (ushort)uStack_7a6;
  uStack_92 = (ushort)uStack_7a5;
  uStack_8e = (ushort)uStack_7a3;
  uStack_8c = (ushort)uStack_7a2;
  uStack_8a = (ushort)uStack_7a1;
  local_a8 = auVar18._0_2_;
  uStack_a6 = auVar18._2_2_;
  uStack_a4 = auVar18._4_2_;
  uStack_a2 = auVar18._6_2_;
  uStack_a0 = auVar18._8_2_;
  uStack_9e = auVar18._10_2_;
  uStack_9c = auVar18._12_2_;
  uStack_9a = auVar18._14_2_;
  local_b8 = auVar16._0_2_;
  uStack_b6 = auVar16._2_2_;
  uStack_b4 = auVar16._4_2_;
  uStack_b2 = auVar16._6_2_;
  uStack_b0 = auVar16._8_2_;
  uStack_ae = auVar16._10_2_;
  uStack_ac = auVar16._12_2_;
  uStack_aa = auVar16._14_2_;
  uVar15 = local_b8 + (ushort)local_7a8 * local_a8 + 0x80;
  uVar14 = uStack_b6 + uStack_96 * uStack_a6 + 0x80;
  uVar20 = uStack_b4 + uStack_94 * uStack_a4 + 0x80;
  uVar22 = uStack_b2 + uStack_92 * uStack_a2 + 0x80;
  uVar24 = uStack_b0 + (ushort)uStack_7a4 * uStack_a0 + 0x80;
  uVar26 = uStack_ae + uStack_8e * uStack_9e + 0x80;
  uVar28 = uStack_ac + uStack_8c * uStack_9c + 0x80;
  uVar30 = uStack_aa + uStack_8a * uStack_9a + 0x80;
  uVar13 = uVar15 >> 8;
  uVar19 = uVar14 >> 8;
  uVar21 = uVar20 >> 8;
  uVar23 = uVar22 >> 8;
  uVar25 = uVar24 >> 8;
  uVar27 = uVar26 >> 8;
  uVar29 = uVar28 >> 8;
  uVar31 = uVar30 >> 8;
  *(ulong *)((long)puVar12 + in_RSI) =
       CONCAT17((uVar31 != 0) * (uVar31 < 0x100) * (char)(uVar30 >> 8) - (0xff < uVar31),
                CONCAT16((uVar29 != 0) * (uVar29 < 0x100) * (char)(uVar28 >> 8) - (0xff < uVar29),
                         CONCAT15((uVar27 != 0) * (uVar27 < 0x100) * (char)(uVar26 >> 8) -
                                  (0xff < uVar27),
                                  CONCAT14((uVar25 != 0) * (uVar25 < 0x100) * (char)(uVar24 >> 8) -
                                           (0xff < uVar25),
                                           CONCAT13((uVar23 != 0) * (uVar23 < 0x100) *
                                                    (char)(uVar22 >> 8) - (0xff < uVar23),
                                                    CONCAT12((uVar21 != 0) * (uVar21 < 0x100) *
                                                             (char)(uVar20 >> 8) - (0xff < uVar21),
                                                             CONCAT11((uVar19 != 0) *
                                                                      (uVar19 < 0x100) *
                                                                      (char)(uVar14 >> 8) -
                                                                      (0xff < uVar19),
                                                                      (uVar13 != 0) *
                                                                      (uVar13 < 0x100) *
                                                                      (char)(uVar15 >> 8) -
                                                                      (0xff < uVar13))))))));
  return;
}

Assistant:

void aom_smooth_v_predictor_8x4_ssse3(
    uint8_t *LIBAOM_RESTRICT dst, ptrdiff_t stride,
    const uint8_t *LIBAOM_RESTRICT top_row,
    const uint8_t *LIBAOM_RESTRICT left_column) {
  const __m128i bottom_left = _mm_set1_epi16(left_column[3]);
  const __m128i weights = cvtepu8_epi16(Load4(smooth_weights));
  const __m128i scale = _mm_set1_epi16(1 << SMOOTH_WEIGHT_LOG2_SCALE);
  const __m128i inverted_weights = _mm_sub_epi16(scale, weights);
  const __m128i scaled_bottom_left =
      _mm_mullo_epi16(inverted_weights, bottom_left);
  const __m128i round = _mm_set1_epi16(1 << (SMOOTH_WEIGHT_LOG2_SCALE - 1));
  __m128i y_select = _mm_set1_epi32(0x01000100);
  const __m128i top = cvtepu8_epi16(LoadLo8(top_row));
  __m128i weights_y = _mm_shuffle_epi8(weights, y_select);
  __m128i scaled_bottom_left_y = _mm_shuffle_epi8(scaled_bottom_left, y_select);
  write_smooth_directional_sum8(dst, &top, &weights_y, &scaled_bottom_left_y,
                                &round);
  dst += stride;
  y_select = _mm_set1_epi32(0x03020302);
  weights_y = _mm_shuffle_epi8(weights, y_select);
  scaled_bottom_left_y = _mm_shuffle_epi8(scaled_bottom_left, y_select);
  write_smooth_directional_sum8(dst, &top, &weights_y, &scaled_bottom_left_y,
                                &round);
  dst += stride;
  y_select = _mm_set1_epi32(0x05040504);
  weights_y = _mm_shuffle_epi8(weights, y_select);
  scaled_bottom_left_y = _mm_shuffle_epi8(scaled_bottom_left, y_select);
  write_smooth_directional_sum8(dst, &top, &weights_y, &scaled_bottom_left_y,
                                &round);
  dst += stride;
  y_select = _mm_set1_epi32(0x07060706);
  weights_y = _mm_shuffle_epi8(weights, y_select);
  scaled_bottom_left_y = _mm_shuffle_epi8(scaled_bottom_left, y_select);
  write_smooth_directional_sum8(dst, &top, &weights_y, &scaled_bottom_left_y,
                                &round);
}